

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test::testBody
          (TEST_MemoryLeakWarningGlobalDetectorTest_crashOnLeakWithOperatorNewArray_Test *this)

{
  byte bVar1;
  void *mem;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  
  MemoryLeakWarningPlugin::setGlobalDetector
            (&((this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).
              dummyDetector)->super_MemoryLeakDetector,
             (this->super_TEST_GROUP_CppUTestGroupMemoryLeakWarningGlobalDetectorTest).dummyReporter
            );
  MemoryLeakWarningPlugin::restoreNewDeleteOverloads();
  crash_on_allocation_number(1);
  mem = operator_new(1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                     ,0x123);
  pUVar2 = UtestShell::getCurrent();
  bVar1 = cpputestHasCrashed;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","cpputestHasCrashed",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
             ,0x124,pTVar3);
  operator_delete(mem,1);
  MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
  return;
}

Assistant:

TEST(MemoryLeakWarningGlobalDetectorTest, crashOnLeakWithOperatorNewArray)
{
    MemoryLeakWarningPlugin::setGlobalDetector(dummyDetector, dummyReporter);

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();

    crash_on_allocation_number(1);
    char* memory = new char;
    CHECK(cpputestHasCrashed);
    delete memory;

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();
}